

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellBST::ComputeKRMmatricesGlobal
          (ChElementShellBST *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  PointerType pdVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined8 uVar16;
  ChElementShellBST *this_00;
  int iVar17;
  uint uVar18;
  SrcEvaluatorType srcEvaluator;
  undefined8 *puVar19;
  ChStateDelta *in_RCX;
  Index index;
  ChStateDelta *pCVar20;
  char *pcVar21;
  double *pdVar22;
  long lVar23;
  long lVar24;
  ChMatrixRef *pCVar25;
  Index dstRows;
  Index size;
  ulong uVar26;
  ChStateDelta *pCVar27;
  ulong uVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  ChMatrixDynamic<> K;
  ChVectorDynamic<> Q1;
  ChVectorDynamic<> Jcolumn;
  ActualDstType actualDst;
  ChState state_x_inc;
  ChVectorDynamic<> Q0;
  ChStateDelta state_delta;
  ChStateDelta state_w;
  ChState state_x;
  SrcEvaluatorType srcEvaluator_1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator_2;
  DenseStorage<double,__1,__1,__1,_1> local_1c8;
  undefined1 local_1a9 [17];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_198;
  ChMatrixRef *local_180;
  DenseStorage<double,__1,__1,__1,_1> local_178;
  double local_160;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_158;
  ulong local_148;
  ChStateDelta *local_140;
  uint local_134;
  ChStateDelta local_130;
  double local_118;
  double local_110;
  ChStateDelta local_108;
  ChState local_f0;
  DstXprType local_d8;
  ChElementShellBST *local_a0;
  ulong local_98;
  PointerType local_90;
  scalar_constant_op<double> local_88;
  long local_80;
  double *local_78;
  ChStateDelta *local_70;
  ChStateDelta local_68;
  DstEvaluatorType *local_50;
  SrcEvaluatorType *local_48;
  ChStateDelta *local_40;
  DstXprType *local_38;
  
  lVar23 = (H->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value;
  local_160 = Mfactor;
  local_118 = Rfactor;
  local_110 = Kfactor;
  iVar17 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[3])();
  if ((lVar23 != iVar17) ||
     (lVar23 = (H->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_cols.m_value,
     iVar17 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[3])(this), lVar23 != iVar17)) {
    __assert_fail("(H.rows() == this->GetNdofs() ) && (H.cols() == this->GetNdofs())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellBST.cpp"
                  ,0x125,
                  "virtual void chrono::fea::ChElementShellBST::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
                 );
  }
  iVar17 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1b])(this);
  ChState::ChState(&local_f0,(long)iVar17,(ChIntegrable *)0x0);
  iVar17 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1c])(this);
  ChStateDelta::ChStateDelta(&local_108,(long)iVar17,(ChIntegrable *)0x0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1d])(this,0,&local_f0);
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x1e])(this,0,&local_108);
  local_180 = H;
  uVar18 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1c])(this);
  iVar17 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
             _vptr_ChElementBase[0x1b])(this);
  pCVar27 = (ChStateDelta *)(long)(int)uVar18;
  local_158.m_storage.m_data = (double *)0x0;
  local_158.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_158,(Index)pCVar27)
  ;
  ComputeInternalForces_impl(this,(ChVectorDynamic<> *)&local_158,&local_f0,in_RCX,false);
  local_1a9._1_8_ = (void *)0x0;
  local_1a9._9_8_ = (ChStateDelta *)0x0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a9 + 1),
             (Index)pCVar27);
  local_198.m_storage.m_data = (double *)0x0;
  local_198.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_198,(Index)pCVar27)
  ;
  pCVar25 = local_180;
  local_140 = pCVar27;
  if ((local_110 != 0.0) || (NAN(local_110))) {
    local_1c8.m_cols = 0;
    local_1c8.m_data = (double *)0x0;
    local_1c8.m_rows = 0;
    if ((int)uVar18 < 0) goto LAB_007839f0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              (&local_1c8,(long)pCVar27 * (long)pCVar27,(Index)pCVar27,(Index)pCVar27);
    ChState::ChState((ChState *)&local_178,(long)iVar17,(ChIntegrable *)0x0);
    ChStateDelta::ChStateDelta(&local_130,(Index)pCVar27,(ChIntegrable *)0x0);
    ChStateDelta::setZero(&local_130,(Index)pCVar27,(ChIntegrable *)0x0);
    pCVar20 = (ChStateDelta *)local_1c8.m_rows;
    local_134 = uVar18;
    if (uVar18 != 0) {
      local_98 = (ulong)uVar18;
      uVar28 = 0;
      uVar26 = 0;
      do {
        if (local_130.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar26) goto LAB_007838b0;
        local_130.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar26] =
             local_130.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar26]
             + 1e-10;
        pCVar20 = (ChStateDelta *)&local_f0;
        (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase[0x1f])(this,0,&local_178,pCVar20,0,&local_130);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a9 + 1),
                   (Index)pCVar27);
        if ((long)local_1a9._9_8_ < 0) goto LAB_0078396e;
        if ((ChStateDelta *)local_1a9._9_8_ != (ChStateDelta *)0x0) {
          memset((void *)local_1a9._1_8_,0,local_1a9._9_8_ << 3);
        }
        ComputeInternalForces_impl
                  (this,(ChVectorDynamic<> *)(local_1a9 + 1),(ChState *)&local_178,pCVar20,false);
        pdVar22 = local_158.m_storage.m_data;
        pCVar20 = (ChStateDelta *)local_1a9._9_8_;
        uVar16 = local_1a9._1_8_;
        local_148 = uVar28;
        if (local_130.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
            (long)uVar26) goto LAB_007838b0;
        local_130.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar26] =
             local_130.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar26]
             + -1e-10;
        if (local_1a9._9_8_ != local_158.m_storage.m_rows) goto LAB_0078394f;
        if ((long)local_1a9._9_8_ < 0) goto LAB_00783938;
        if ((local_198.m_storage.m_rows != local_1a9._9_8_) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_198,local_1a9._9_8_,1),
           (ChStateDelta *)local_198.m_storage.m_rows != pCVar20)) goto LAB_00783990;
        auVar29 = vbroadcastsd_avx512f(ZEXT816(0xc202a05f20000000));
        pCVar27 = (ChStateDelta *)((ulong)pCVar20 & 0x7ffffffffffffff8);
        if ((ChStateDelta *)&DAT_00000007 < pCVar20) {
          uVar28 = 0;
          do {
            auVar30 = vsubpd_avx512f(*(undefined1 (*) [64])(uVar16 + uVar28 * 8),
                                     *(undefined1 (*) [64])(pdVar22 + uVar28));
            auVar30 = vmulpd_avx512f(auVar30,auVar29);
            *(undefined1 (*) [64])(local_198.m_storage.m_data + uVar28) = auVar30;
            uVar28 = uVar28 + 8;
          } while (uVar28 < pCVar27);
        }
        if ((long)pCVar27 < (long)pCVar20) {
          do {
            local_198.m_storage.m_data[(long)pCVar27] =
                 (*(double *)(uVar16 + (long)pCVar27 * 8) - pdVar22[(long)pCVar27]) * -10000000000.0
            ;
            pCVar27 = (ChStateDelta *)
                      ((long)&(pCVar27->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
          } while (pCVar20 != pCVar27);
        }
        if (local_1c8.m_rows < 0 && local_1c8.m_data != (double *)0x0) goto LAB_00783916;
        if (local_1c8.m_cols <= (long)uVar26) goto LAB_007838f4;
        if ((ChStateDelta *)local_1c8.m_rows != pCVar20) goto LAB_007838d2;
        if (pCVar20 != (ChStateDelta *)0x0) {
          pdVar22 = (double *)((long)local_1c8.m_data + local_148);
          pCVar27 = (ChStateDelta *)0x0;
          do {
            pdVar2 = local_198.m_storage.m_data + (long)pCVar27;
            pCVar27 = (ChStateDelta *)
                      ((long)&(pCVar27->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
            *pdVar22 = *pdVar2;
            pdVar22 = pdVar22 + local_1c8.m_cols;
          } while (pCVar20 != pCVar27);
        }
        uVar26 = uVar26 + 1;
        uVar28 = local_148 + 8;
        pCVar27 = local_140;
      } while (uVar26 != local_98);
    }
    uVar18 = local_134;
    if (-1 < (long)(local_1c8.m_cols | (ulong)pCVar20)) {
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_data = (local_180->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_outerStride =
           (local_180->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).m_stride.m_outer.m_value;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_xpr = local_180;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startRow.m_value = 0;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_cols.m_value = (long)pCVar27;
      if (((local_180->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < (long)pCVar27) ||
         ((local_180->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value < (long)pCVar27)) goto LAB_007839af;
      local_88.m_other = local_110;
      local_78 = local_1c8.m_data;
      local_70 = (ChStateDelta *)local_1c8.m_cols;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_rows.m_value = (long)pCVar27;
      if ((pCVar20 != pCVar27) || ((ChStateDelta *)local_1c8.m_cols != pCVar27)) {
        pcVar21 = 
        "void Eigen::DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>]"
        ;
        goto LAB_007838e7;
      }
      local_50 = (DstEvaluatorType *)&local_68;
      local_48 = (SrcEvaluatorType *)&local_90;
      local_40 = (ChStateDelta *)local_1a9;
      local_38 = &local_d8;
      local_68.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           local_d8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
           .m_data;
      local_68.integrable =
           (ChIntegrable *)
           local_d8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .m_outerStride;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)&local_50);
      pCVar25 = local_180;
      if (local_130.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_130.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_178.m_data != (double *)0x0) {
        free((void *)local_178.m_data[-1]);
      }
      if (local_1c8.m_data != (double *)0x0) {
        free((void *)local_1c8.m_data[-1]);
      }
      goto LAB_0078331f;
    }
  }
  else {
    if (((local_180->
         super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
         .
         super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_cols.m_value |
        (local_180->
        super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
        .
        super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_rows.m_value) < 0) {
      pcVar21 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_00783983;
    }
    local_d8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_rows.m_value = (long)&local_50;
    local_d8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_data = (PointerType)&local_90;
    local_50 = (DstEvaluatorType *)0x0;
    local_90 = (local_180->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
               .
               super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
    local_80 = (local_180->
               super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).m_stride.m_outer.m_value;
    local_d8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
    .m_cols.m_value = (long)&local_68;
    local_d8.
    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
    .m_xpr = local_180;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_d8);
LAB_0078331f:
    if ((local_118 == 0.0) && (!NAN(local_118))) {
LAB_0078372e:
      if ((local_160 != 0.0) || (NAN(local_160))) {
        dVar31 = local_160;
        (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase[0x28])(this);
        uVar26 = (pCVar25->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value;
        lVar24 = 0;
        dVar31 = dVar31 * this->tot_thickness * this->area * 0.3333333333333333;
        lVar23 = 0;
        do {
          if (((long)uVar26 <= lVar24) ||
             (uVar28 = (pCVar25->
                       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                       ).
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                       .
                       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                       .m_cols.m_value, (long)uVar28 <= lVar24)) {
LAB_00783891:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                         );
          }
          lVar7 = (pCVar25->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).m_stride.m_outer.m_value;
          pdVar8 = (pCVar25->
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   ).
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                   .
                   super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                   .m_data;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)((long)pdVar8 + lVar7 * lVar24 * 8 + lVar23);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_160;
          auVar32._8_8_ = 0;
          auVar32._0_8_ = dVar31;
          auVar9 = vfmadd231sd_fma(auVar34,auVar32,auVar4);
          *(long *)((long)pdVar8 + lVar7 * lVar24 * 8 + lVar23) = auVar9._0_8_;
          uVar1 = lVar24 + 1;
          if ((uVar26 <= uVar1) || (uVar28 <= uVar1)) goto LAB_00783891;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = *(ulong *)((long)pdVar8 + uVar1 * lVar7 * 8 + lVar23 + 8);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_160;
          auVar9 = vfmadd231sd_fma(auVar35,auVar32,auVar5);
          *(long *)((long)pdVar8 + uVar1 * lVar7 * 8 + lVar23 + 8) = auVar9._0_8_;
          uVar1 = lVar24 + 2;
          if ((uVar26 <= uVar1) || (uVar28 <= uVar1)) goto LAB_00783891;
          lVar24 = lVar24 + 3;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)((long)pdVar8 + lVar7 * uVar1 * 8 + lVar23 + 0x10);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = local_160;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = dVar31;
          auVar9 = vfmadd231sd_fma(auVar36,auVar33,auVar6);
          *(long *)((long)pdVar8 + lVar7 * uVar1 * 8 + lVar23 + 0x10) = auVar9._0_8_;
          lVar23 = lVar23 + 0x18;
        } while (lVar24 != 9);
      }
      if (local_198.m_storage.m_data != (double *)0x0) {
        free((void *)local_198.m_storage.m_data[-1]);
      }
      if ((void *)local_1a9._1_8_ != (void *)0x0) {
        free(*(void **)(local_1a9._1_8_ + -8));
      }
      if (local_158.m_storage.m_data != (double *)0x0) {
        free((void *)local_158.m_storage.m_data[-1]);
      }
      if (local_108.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_108.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      if (local_f0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
          (double *)0x0) {
        free((void *)local_f0.super_ChVectorDynamic<double>.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     [-1]);
      }
      return;
    }
    ChStateDelta::ChStateDelta((ChStateDelta *)&local_1c8,(Index)pCVar27,(ChIntegrable *)0x0);
    pdVar22 = local_108.super_ChVectorDynamic<double>.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    if ((local_1c8.m_rows !=
         local_108.super_ChVectorDynamic<double>.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1c8,
                   local_108.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,1
                  ),
       local_1c8.m_rows !=
       local_108.super_ChVectorDynamic<double>.
       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)) {
      pcVar21 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
      ;
LAB_007839a5:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar21);
    }
    pCVar20 = (ChStateDelta *)
              ((long)&(((ChVectorDynamic<double> *)
                       local_108.super_ChVectorDynamic<double>.
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data + 7);
    if (-1 < local_108.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pCVar20 = (ChStateDelta *)
                local_108.super_ChVectorDynamic<double>.
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    }
    pCVar20 = (ChStateDelta *)((ulong)pCVar20 & 0xfffffffffffffff8);
    if (7 < local_108.super_ChVectorDynamic<double>.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      lVar23 = 0;
      do {
        pdVar2 = pdVar22 + lVar23;
        dVar31 = pdVar2[1];
        dVar10 = pdVar2[2];
        dVar11 = pdVar2[3];
        dVar12 = pdVar2[4];
        dVar13 = pdVar2[5];
        dVar14 = pdVar2[6];
        dVar15 = pdVar2[7];
        pdVar3 = local_1c8.m_data + lVar23;
        *pdVar3 = *pdVar2;
        pdVar3[1] = dVar31;
        pdVar3[2] = dVar10;
        pdVar3[3] = dVar11;
        pdVar3[4] = dVar12;
        pdVar3[5] = dVar13;
        pdVar3[6] = dVar14;
        pdVar3[7] = dVar15;
        lVar23 = lVar23 + 8;
      } while (lVar23 < (long)pCVar20);
    }
    if ((long)pCVar20 <
        local_108.super_ChVectorDynamic<double>.
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      do {
        local_1c8.m_data[(long)pCVar20] = pdVar22[(long)pCVar20];
        pCVar20 = (ChStateDelta *)
                  ((long)&(pCVar20->super_ChVectorDynamic<double>).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                          m_data + 1);
      } while ((ChStateDelta *)
               local_108.super_ChVectorDynamic<double>.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
               pCVar20);
    }
    local_178.m_cols = 0;
    local_178.m_data = (double *)0x0;
    local_178.m_rows = 0;
    local_1c8.m_cols = (Index)local_108.integrable;
    if ((int)uVar18 < 0) {
LAB_007839f0:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    if ((uVar18 != 0) &&
       (auVar9._8_8_ = 0, auVar9._0_8_ = pCVar27,
       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar9,0) < pCVar27)) {
      puVar19 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar19 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar19,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              (&local_178,(long)pCVar27 * (long)pCVar27,(Index)pCVar27,(Index)pCVar27);
    pCVar20 = (ChStateDelta *)local_178.m_rows;
    if (uVar18 != 0) {
      local_148 = (ulong)uVar18;
      lVar23 = 0;
      uVar26 = 0;
      local_a0 = this;
      do {
        this_00 = local_a0;
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_1a9 + 1),
                   (Index)local_140);
        if ((long)local_1a9._9_8_ < 0) goto LAB_0078396e;
        if ((ChStateDelta *)local_1a9._9_8_ != (ChStateDelta *)0x0) {
          memset((void *)local_1a9._1_8_,0,local_1a9._9_8_ << 3);
        }
        if (local_1c8.m_rows <= (long)uVar26) {
LAB_007838b0:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        local_1c8.m_data[uVar26] = local_1c8.m_data[uVar26] + 1e-10;
        ComputeInternalForces_impl
                  (this_00,(ChVectorDynamic<> *)(local_1a9 + 1),&local_f0,pCVar27,false);
        pdVar22 = local_158.m_storage.m_data;
        pCVar20 = (ChStateDelta *)local_1a9._9_8_;
        uVar16 = local_1a9._1_8_;
        if (local_1c8.m_rows <= (long)uVar26) goto LAB_007838b0;
        local_1c8.m_data[uVar26] = local_1c8.m_data[uVar26] + -1e-10;
        if (local_1a9._9_8_ != local_158.m_storage.m_rows) {
LAB_0078394f:
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if ((long)local_1a9._9_8_ < 0) goto LAB_00783938;
        if ((local_198.m_storage.m_rows != local_1a9._9_8_) &&
           (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      (&local_198,local_1a9._9_8_,1),
           (ChStateDelta *)local_198.m_storage.m_rows != pCVar20)) goto LAB_00783990;
        auVar29 = vbroadcastsd_avx512f(ZEXT816(0xc202a05f20000000));
        pCVar27 = (ChStateDelta *)((ulong)pCVar20 & 0x7ffffffffffffff8);
        if ((ChStateDelta *)&DAT_00000007 < pCVar20) {
          uVar28 = 0;
          do {
            auVar30 = vsubpd_avx512f(*(undefined1 (*) [64])(uVar16 + uVar28 * 8),
                                     *(undefined1 (*) [64])(pdVar22 + uVar28));
            auVar30 = vmulpd_avx512f(auVar30,auVar29);
            *(undefined1 (*) [64])(local_198.m_storage.m_data + uVar28) = auVar30;
            uVar28 = uVar28 + 8;
          } while (uVar28 < pCVar27);
        }
        if ((long)pCVar27 < (long)pCVar20) {
          do {
            local_198.m_storage.m_data[(long)pCVar27] =
                 (*(double *)(uVar16 + (long)pCVar27 * 8) - pdVar22[(long)pCVar27]) * -10000000000.0
            ;
            pCVar27 = (ChStateDelta *)
                      ((long)&(pCVar27->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
          } while (pCVar20 != pCVar27);
        }
        if (local_178.m_rows < 0 && local_178.m_data != (double *)0x0) {
LAB_00783916:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                       );
        }
        if (local_178.m_cols <= (long)uVar26) {
LAB_007838f4:
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        if ((ChStateDelta *)local_178.m_rows != pCVar20) goto LAB_007838d2;
        if (pCVar20 != (ChStateDelta *)0x0) {
          pdVar22 = (double *)((long)local_178.m_data + lVar23);
          pCVar27 = (ChStateDelta *)0x0;
          do {
            pdVar2 = local_198.m_storage.m_data + (long)pCVar27;
            pCVar27 = (ChStateDelta *)
                      ((long)&(pCVar27->super_ChVectorDynamic<double>).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data + 1);
            *pdVar22 = *pdVar2;
            pdVar22 = pdVar22 + local_178.m_cols;
          } while (pCVar20 != pCVar27);
        }
        uVar26 = uVar26 + 1;
        lVar23 = lVar23 + 8;
        pCVar27 = (ChStateDelta *)local_178.m_cols;
        this = local_a0;
      } while (uVar26 != local_148);
    }
    if (-1 < (long)(local_178.m_cols | (ulong)pCVar20)) {
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_data = (local_180->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_outerStride =
           (local_180->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).m_stride.m_outer.m_value;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_rows.m_value = (long)local_140;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
      .m_cols.m_value = (long)local_140;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_xpr = local_180;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startRow.m_value = 0;
      local_d8.
      super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      if (((local_180->
           super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
           ).
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
           .
           super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
           .m_rows.m_value < (long)local_140) ||
         ((local_180->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_cols.m_value < (long)local_140)) {
LAB_007839af:
        local_d8.
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
        .m_startCol.m_value = 0;
        local_d8.
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
        .m_startRow.m_value = 0;
        local_180 = local_d8.
                    super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
                    .m_xpr;
        local_d8.
        super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
        .
        super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
        .
        super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
        .m_rows.m_value =
             local_d8.
             super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
             .m_cols.m_value;
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_88.m_other = local_118;
      local_78 = local_178.m_data;
      local_70 = (ChStateDelta *)local_178.m_cols;
      if ((pCVar20 != local_140) || ((ChStateDelta *)local_178.m_cols != local_140)) {
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                     );
      }
      local_50 = (DstEvaluatorType *)&local_68;
      local_48 = (SrcEvaluatorType *)&local_90;
      local_40 = &local_130;
      local_38 = &local_d8;
      local_68.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           local_d8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>,_0>
           .m_data;
      local_68.integrable =
           (ChIntegrable *)
           local_d8.
           super_BlockImpl<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false,_true>
           .m_outerStride;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>,_Eigen::internal::add_assign_op<double,_double>,_0>
             *)&local_50);
      pCVar25 = local_180;
      if (local_178.m_data != (double *)0x0) {
        free((void *)local_178.m_data[-1]);
      }
      if (local_1c8.m_data != (double *)0x0) {
        free((void *)local_1c8.m_data[-1]);
      }
      goto LAB_0078372e;
    }
  }
  pcVar21 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
  ;
LAB_00783983:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar21);
LAB_0078396e:
  pcVar21 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_00783983;
LAB_00783938:
  pcVar21 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
  ;
  goto LAB_00783983;
LAB_00783990:
  pcVar21 = 
  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>>, T1 = double, T2 = double]"
  ;
  goto LAB_007839a5;
LAB_007838d2:
  pcVar21 = 
  "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
  ;
LAB_007838e7:
  __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar21);
}

Assistant:

void ChElementShellBST::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {

	assert((H.rows() == this->GetNdofs() ) && (H.cols() == this->GetNdofs()));

	// BRUTE FORCE METHOD: USE NUMERICAL DIFFERENTIATION!

	//
	// The K stiffness matrix of this element:  
	//

	ChState      state_x(this->LoadableGet_ndof_x(), nullptr);
	ChStateDelta state_w(this->LoadableGet_ndof_w(), nullptr);
	this->LoadableGetStateBlock_x(0, state_x);
	this->LoadableGetStateBlock_w(0, state_w);

	double Delta = 1e-10;

	int mrows_w = this->LoadableGet_ndof_w();
	int mrows_x = this->LoadableGet_ndof_x();

	
	// compute Q at current speed & position, x_0, v_0
	ChVectorDynamic<> Q0(mrows_w);
	this->ComputeInternalForces_impl(Q0, state_x, state_w, true);     // Q0 = Q(x, v)

	ChVectorDynamic<> Q1(mrows_w);
	ChVectorDynamic<> Jcolumn(mrows_w);
	

	if (Kfactor) {
		ChMatrixDynamic<> K(mrows_w, mrows_w);

		ChState       state_x_inc(mrows_x, nullptr);
		ChStateDelta  state_delta(mrows_w, nullptr);

		// Compute K=-dQ(x,v)/dx by backward differentiation
		state_delta.setZero(mrows_w, nullptr);

		for (int i = 0; i < mrows_w; ++i) {
			state_delta(i) += Delta;
			this->LoadableStateIncrement(0, state_x_inc, state_x, 0, state_delta);  // exponential, usually state_x_inc(i) = state_x(i) + Delta;

			Q1.setZero(mrows_w);
			this->ComputeInternalForces_impl(Q1, state_x_inc, state_w, true);   // Q1 = Q(x+Dx, v)
			state_delta(i) -= Delta;

			Jcolumn = (Q1 - Q0) * (-1.0 / Delta);   // - sign because K=-dQ/dx
			K.col(i) = Jcolumn;
		}

		// finally, store K into H:
		H.block(0, 0, mrows_w, mrows_w) = Kfactor * K;
	}
	else
		H.setZero();


	//
	// The R damping matrix of this element: 
	//

	if (Rfactor) {
		// Compute R=-dQ(x,v)/dv by backward differentiation
		//if (this->section->GetDamping()) {
		ChStateDelta  state_w_inc(mrows_w, nullptr);
		state_w_inc = state_w;
		ChMatrixDynamic<> R(mrows_w, mrows_w);

		for (int i = 0; i < mrows_w; ++i) {
			Q1.setZero(mrows_w);

			state_w_inc(i) += Delta;
			this->ComputeInternalForces_impl(Q1, state_x, state_w_inc, true); // Q1 = Q(x, v+Dv)
			state_w_inc(i) -= Delta;

			Jcolumn = (Q1 - Q0) * (-1.0 / Delta);   // - sign because R=-dQ/dv
			R.col(i) = Jcolumn;
		}

		H.block(0, 0, mrows_w, mrows_w) += Rfactor * R;
	}

	//
	// The M mass matrix of this element: (lumped version)
	//

	if (Mfactor) {
		// loop over all layers, to compute total "mass per area" = sum(rho_i*thickness_i) = average_rho * sum(thickness_i)
		double avg_density = this->GetDensity();
		double mass_per_area = avg_density * tot_thickness;

		// Heuristic, simplified 'lumped' mass matrix to central three nodes.
		// This is simpler than the stiffness-consistent mass matrix that would require
		// integration over gauss points.

		double nodemass = (1.0 / 3.0) * (this->area * mass_per_area);

		for (int n = 0; n < 3; n++) {

			int node_off = n * 3;
			H(node_off + 0, node_off + 0) += Mfactor * nodemass;
			H(node_off + 1, node_off + 1) += Mfactor * nodemass;
			H(node_off + 2, node_off + 2) += Mfactor * nodemass;

		}
	}
}